

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_mac_impl.c
# Opt level: O0

void * blake2_mac_dup(void *vsrc)

{
  int iVar1;
  void *in_RDI;
  blake2_mac_data_st_conflict *src;
  blake2_mac_data_st_conflict *dst;
  char *in_stack_ffffffffffffffe8;
  void *num;
  undefined8 local_8;
  
  num = in_RDI;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = CRYPTO_zalloc((size_t)num,in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20));
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      memcpy(local_8,in_RDI,0xc0);
    }
  }
  return local_8;
}

Assistant:

static void *blake2_mac_dup(void *vsrc)
{
    struct blake2_mac_data_st *dst;
    struct blake2_mac_data_st *src = vsrc;

    if (!ossl_prov_is_running())
        return NULL;

    dst = OPENSSL_zalloc(sizeof(*dst));
    if (dst == NULL)
        return NULL;

    *dst = *src;
    return dst;
}